

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O2

ivec4 ImageCodec::decodeSINT_SINTPacked<int>(ImageCodec *codec,void *ptr)

{
  uint32_t numBits;
  pointer pSVar1;
  anon_union_16_4_ea85571f_for_vec<4,_int,_(glm::precision)0>_3 aVar2;
  int32_t iVar3;
  int *piVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  anon_union_16_4_ea85571f_for_vec<4,_int,_(glm::precision)0>_3 local_48;
  
  local_48._0_8_ = 0;
  local_48._8_8_ = 0;
  lVar6 = 8;
  for (uVar5 = 0;
      pSVar1 = (codec->packedSampleInfo).
               super__Vector_base<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(codec->packedSampleInfo).
                             super__Vector_base<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0xc);
      uVar5 = uVar5 + 1) {
    numBits = *(uint32_t *)((long)&pSVar1->elementIndex + lVar6);
    iVar3 = imageio::sign_extend
                      (~(-1 << ((byte)numBits & 0x1f)) &
                       *(uint *)((long)ptr + (ulong)*(uint *)((long)pSVar1 + lVar6 + -8) * 4) >>
                       (*(byte *)((long)pSVar1 + lVar6 + -4) & 0x1f),numBits);
    piVar4 = glm::vec<4,_int,_(glm::precision)0>::operator[]
                       ((vec<4,_int,_(glm::precision)0> *)&local_48.field_0,(length_type)uVar5);
    *piVar4 = iVar3;
    lVar6 = lVar6 + 0xc;
  }
  aVar2._8_8_ = local_48._8_8_;
  aVar2._0_8_ = local_48._0_8_;
  return (anon_union_16_4_ea85571f_for_vec<4,_int,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_int,_(glm::precision)0>_3)aVar2.field_0;
}

Assistant:

static glm::ivec4 decodeSINT_SINTPacked(const ImageCodec* codec, const void* ptr) {
        static_assert(std::is_signed_v<TYPE>);
        auto data = reinterpret_cast<const std::make_unsigned_t<TYPE>*>(ptr);
        glm::ivec4 result(0, 0, 0, 0);
        for (std::size_t i = 0; i < codec->packedSampleInfo.size(); ++i) {
            const auto& info = codec->packedSampleInfo[i];
            uint32_t rawValue = (data[info.elementIndex] >> info.bitOffset) & ((1u << info.bitLength) - 1u);
            result[static_cast<glm::length_t>(i)] = imageio::sign_extend(rawValue, info.bitLength);
        }
        return result;
    }